

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O2

void __thiscall helics::apps::Recorder::loadCaptureInterfaces(Recorder *this)

{
  pointer pbVar1;
  element_type *peVar2;
  pointer pbVar3;
  pointer pcVar4;
  pointer pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pub;
  pointer pbVar6;
  string_view key;
  string_view target;
  string_view queryres;
  string_view queryStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pubs;
  string local_50;
  
  pbVar1 = (this->captureInterfaces).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar5 = (this->captureInterfaces).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1) {
    peVar2 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pcVar4 = (pbVar5->_M_dataplus)._M_p;
    target._M_str = pcVar4;
    target._M_len = pbVar5->_M_string_length;
    queryStr._M_str = "publications";
    queryStr._M_len = 0xc;
    Federate::query_abi_cxx11_
              (&local_50,
               (Federate *)
               ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
               (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]),target,queryStr,
               HELICS_SEQUENCING_MODE_FAST);
    queryres._M_str = pcVar4;
    queryres._M_len = (size_t)local_50._M_dataplus._M_p;
    vectorizeQueryResult_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&pubs,(helics *)local_50._M_string_length,queryres);
    std::__cxx11::string::~string((string *)&local_50);
    pbVar3 = pubs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar6 = pubs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar3; pbVar6 = pbVar6 + 1)
    {
      key._M_str = (pbVar6->_M_dataplus)._M_p;
      key._M_len = pbVar6->_M_string_length;
      addSubscription(this,key);
    }
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&pubs);
  }
  return;
}

Assistant:

void Recorder::loadCaptureInterfaces()
{
    for (auto& capt : captureInterfaces) {
        auto pubs =
            vectorizeQueryResult(fed->query(capt, "publications", HELICS_SEQUENCING_MODE_FAST));
        for (auto& pub : pubs) {
            addSubscription(pub);
        }
    }
}